

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_dump.h
# Opt level: O0

void __thiscall
phmap::BinaryInputArchive::BinaryInputArchive(BinaryInputArchive *this,char *file_path)

{
  char *pcVar1;
  _Ios_Openmode _Var2;
  ifstream *this_00;
  anon_class_8_1_8991fb9c local_30 [3];
  char *local_18;
  char *file_path_local;
  BinaryInputArchive *this_local;
  
  local_18 = file_path;
  file_path_local = (char *)this;
  std::function<void_()>::function(&this->destruct_);
  this_00 = (ifstream *)operator_new(0x208);
  pcVar1 = local_18;
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(this_00,pcVar1,_Var2);
  this->is_ = (istream *)this_00;
  local_30[0].this = this;
  std::function<void()>::operator=((function<void()> *)&this->destruct_,local_30);
  return;
}

Assistant:

BinaryInputArchive(const char * file_path) {
      is_ = new std::ifstream(file_path,
                              std::ifstream::in | std::ifstream::binary);
      destruct_ = [this]() { delete is_; };
    }